

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O2

void __thiscall MicroTerm::connectionCreated(MicroTerm *this,Stream *stream)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Incoming connection ");
  Dashel::Stream::getTargetName_abi_cxx11_(&sStack_38,stream);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void connectionCreated(Stream* stream)
	{
		cout << "Incoming connection " << stream->getTargetName() << " (" << stream << ")" << endl;
	}